

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall
QRegularExpression::setPatternOptions(QRegularExpression *this,PatternOptions options)

{
  QRegularExpressionPrivate *pQVar1;
  
  pQVar1 = (this->d).d.ptr;
  if ((QFlagsStorageHelper<QRegularExpression::PatternOption,_4>)
      (pQVar1->patternOptions).super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
      super_QFlagsStorage<QRegularExpression::PatternOption>.i !=
      (QFlagsStorage<QRegularExpression::PatternOption>)
      options.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
      super_QFlagsStorage<QRegularExpression::PatternOption>.i) {
    if ((pQVar1 != (QRegularExpressionPrivate *)0x0) &&
       ((__atomic_base<int>)
        *(__int_type_conflict *)
         &(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1)) {
      QExplicitlySharedDataPointer<QRegularExpressionPrivate>::detach_helper(&this->d);
    }
    pQVar1 = (this->d).d.ptr;
    pQVar1->isDirty = true;
    (pQVar1->patternOptions).super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
    super_QFlagsStorage<QRegularExpression::PatternOption>.i =
         (Int)options.super_QFlagsStorageHelper<QRegularExpression::PatternOption,_4>.
              super_QFlagsStorage<QRegularExpression::PatternOption>.i;
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }